

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smc.cpp
# Opt level: O2

void __thiscall SMC::fragdis(SMC *this,string *fname,int label)

{
  double dVar1;
  pointer pbVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  int local_2a4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  token;
  string line;
  ifstream input;
  byte abStack_218 [488];
  
  std::ifstream::ifstream(&input,(fname->_M_dataplus)._M_p,_S_in);
  local_2a4 = -1;
  iVar3 = 0;
  while ((abStack_218[*(long *)(_input + -0x18)] & 2) == 0) {
    line._M_string_length = 0;
    line.field_2._M_local_buf[0] = '\0';
    line._M_dataplus._M_p = (pointer)&line.field_2;
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&input,(string *)&line);
    if (*line._M_dataplus._M_p != '#') {
      token.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      token.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      token.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      split(&line,' ',&token);
      pbVar2 = token.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar4 = (long)token.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)token.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5;
      lVar5 = (long)local_2a4;
      if (lVar4 == 4) {
        local_2a4 = local_2a4 + 1;
        dVar1 = atof(((token.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p);
        this->minDistcon[label][lVar5 + 1] = dVar1;
        dVar1 = atof(pbVar2[1]._M_dataplus._M_p);
        this->DistconBy[label][lVar5 + 1] = dVar1;
        dVar1 = atof(pbVar2[2]._M_dataplus._M_p);
        this->minDistdel[label][lVar5 + 1] = dVar1;
        dVar1 = atof(pbVar2[3]._M_dataplus._M_p);
        this->DistdelBy[label][lVar5 + 1] = dVar1;
        iVar3 = 0;
      }
      else if (lVar4 == 0x20) {
        for (lVar4 = 0; lVar4 != 0x100; lVar4 = lVar4 + 8) {
          dVar1 = atof(*(char **)((long)&(pbVar2->_M_dataplus)._M_p + lVar4 * 4));
          *(double *)((long)this->etedCon[label][lVar5][iVar3] + lVar4) = dVar1;
        }
        iVar3 = iVar3 + 1;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&token);
    }
    std::__cxx11::string::~string((string *)&line);
  }
  std::ifstream::~ifstream(&input);
  return;
}

Assistant:

void SMC::fragdis(string fname, int label) {
    // Populate etedP collection of distance lengths
    // Conditional distribution
    ifstream input(fname.c_str());
    int Countset = 0, FraglenCount = -1;
    while (!input.eof()) {
        // Read line
        string line;
        getline(input, line);
        if (line[0] == '#') continue;
        // Tokenize by tabs
        vector<string> token;
        split(line, ' ', token);
        if (token.size() == 4) {
            FraglenCount++;
            Countset = 0;
            minDistcon[label][FraglenCount] = atof(token[0].c_str());
            DistconBy[label][FraglenCount] = atof(token[1].c_str());
            minDistdel[label][FraglenCount] = atof(token[2].c_str());
            DistdelBy[label][FraglenCount] = atof(token[3].c_str());
        }
        else if (token.size() == 32) {
            for (int i = 0; i < 32; i++) {
                etedCon[label][FraglenCount][Countset][i] = atof(token[i].c_str());
            }
            Countset++;
        }
    }
}